

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# goesrecv.cc
# Opt level: O2

int main(int argc,char **argv)

{
  Type t;
  bool bVar1;
  ostream *poVar2;
  __shared_ptr<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_3c0;
  Decoder decode;
  Options opts;
  Demodulator demod;
  Monitor monitor;
  Config config;
  sigaction sa;
  
  parseOptions(&opts,argc,argv);
  Config::load(&config,&opts.config);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &config,"lrit");
  if (bVar1) {
    t = LRIT;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &config,"hrit");
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Invalid downlink type: ");
      poVar2 = std::operator<<(poVar2,(string *)&config);
      std::endl<char,std::char_traits<char>>(poVar2);
      exit(1);
    }
    t = HRIT;
  }
  Demodulator::Demodulator(&demod,t);
  Demodulator::initialize(&demod,&config);
  std::
  __shared_ptr<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_3c0,
                 &demod.softBitsQueue_.
                  super___shared_ptr<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  Decoder::Decoder(&decode,(shared_ptr<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                            *)&local_3c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3c0._M_refcount);
  Decoder::initialize(&decode,&config);
  Monitor::Monitor(&monitor,opts.verbose,opts.interval);
  Monitor::initialize(&monitor,&config);
  sa.__sigaction_handler.sa_handler = signalHandler;
  sigemptyset((sigset_t *)&sa.sa_mask);
  sa.sa_flags = 0;
  sigaction(2,(sigaction *)&sa,(sigaction *)0x0);
  sigaction(0xf,(sigaction *)&sa,(sigaction *)0x0);
  Demodulator::start(&demod);
  Decoder::start(&decode);
  Monitor::start(&monitor);
  while (sigint == '\0') {
    pause();
  }
  Demodulator::stop(&demod);
  Decoder::stop(&decode);
  Monitor::stop(&monitor);
  Monitor::~Monitor(&monitor);
  Decoder::~Decoder(&decode);
  Demodulator::~Demodulator(&demod);
  Config::~Config(&config);
  std::__cxx11::string::~string((string *)&opts);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  auto opts = parseOptions(argc, argv);
  auto config = Config::load(opts.config);

  // Convert string option to enum
  Demodulator::Type downlinkType;
  if (config.demodulator.downlinkType == "lrit") {
    downlinkType = Demodulator::LRIT;
  } else if (config.demodulator.downlinkType == "hrit") {
    downlinkType = Demodulator::HRIT;
  } else {
    std::cerr
      << "Invalid downlink type: "
      << config.demodulator.downlinkType
      << std::endl;
    exit(1);
  }

  Demodulator demod(downlinkType);
  demod.initialize(config);

  Decoder decode(demod.getSoftBitsQueue());
  decode.initialize(config);

  Monitor monitor(opts.verbose, opts.interval);
  monitor.initialize(config);

  // Install signal handler
  struct sigaction sa;
  sa.sa_handler = signalHandler;
  sigemptyset(&sa.sa_mask);
  sa.sa_flags = 0;
  sigaction(SIGINT, &sa, NULL);
  sigaction(SIGTERM, &sa, NULL);

  demod.start();
  decode.start();
  monitor.start();

  while (!sigint) {
    pause();
  }

  demod.stop();
  decode.stop();
  monitor.stop();

  return 0;
}